

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_disk_posix.c
# Opt level: O2

la_int64_t archive_write_disk_gid(archive *_a,char *name,la_int64_t id)

{
  code *UNRECOVERED_JUMPTABLE;
  int iVar1;
  la_int64_t lVar2;
  
  iVar1 = __archive_check_magic(_a,0xc001b0c5,0x7fff,"archive_write_disk_gid");
  if (iVar1 == -0x1e) {
    id = -0x1e;
  }
  else {
    UNRECOVERED_JUMPTABLE = (code *)_a[1].error_string.s;
    if (UNRECOVERED_JUMPTABLE != (code *)0x0) {
      lVar2 = (*UNRECOVERED_JUMPTABLE)(_a[1].error_string.buffer_length,name,id);
      return lVar2;
    }
  }
  return id;
}

Assistant:

int64_t
archive_write_disk_gid(struct archive *_a, const char *name, la_int64_t id)
{
       struct archive_write_disk *a = (struct archive_write_disk *)_a;
       archive_check_magic(&a->archive, ARCHIVE_WRITE_DISK_MAGIC,
           ARCHIVE_STATE_ANY, "archive_write_disk_gid");
       if (a->lookup_gid)
               return (a->lookup_gid)(a->lookup_gid_data, name, id);
       return (id);
}